

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_sCp(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  double dVar2;
  
  if (in->a < 0x81) {
    out->b = 0xff;
    out->r = 0xff;
    out->g = 0xff;
    uVar1 = 0;
  }
  else {
    dVar2 = (double)in->r / (double)in->a;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    out->r = (int)dVar2 & 0xff;
    dVar2 = (double)in->g / (double)in->a;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    out->g = (int)dVar2 & 0xff;
    dVar2 = (double)in->b / (double)in->a;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    out->b = (int)dVar2 & 0xff;
    dVar2 = floor((double)in->a / 257.0 + 0.5);
    uVar1 = (int)dVar2 & 0xff;
  }
  out->a = uVar1;
  return;
}

Assistant:

static void
gpc_sCp(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = sRGB((double)in->r / in->a);
      out->g = sRGB((double)in->g / in->a);
      out->b = sRGB((double)in->b / in->a);
      out->a = u8d(in->a / 257.);
   }
}